

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Cluster::~Cluster(Cluster *this)

{
  Cluster *this_local;
  
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Cluster_0037bad8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->indices);
  std::vector<float,_std::allocator<float>_>::~vector(&this->weights);
  Deformer::~Deformer(&this->super_Deformer);
  return;
}

Assistant:

Cluster::~Cluster()
{

}